

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  byte bVar1;
  uint32_t uVar2;
  LYS_NODE LVar3;
  lyd_attr *attr;
  lys_node *plVar4;
  lyxp_set_type lVar5;
  int iVar6;
  int iVar7;
  ly_ctx *plVar8;
  ly_ctx *plVar9;
  lys_module *plVar10;
  lyd_attr *plVar11;
  lyd_attr *plVar12;
  lyxp_node_type *plVar13;
  uint16_t *puVar14;
  char *pcVar15;
  ulong uVar16;
  lyxp_set *plVar17;
  lys_module *plVar18;
  lys_node *plVar19;
  lys_node *node;
  LY_ERR *pLVar20;
  ushort uVar21;
  ushort uVar22;
  long lVar23;
  undefined8 uVar24;
  lyxp_node_type lVar25;
  lyxp_token *plVar26;
  char *pcVar27;
  lyxp_set_nodes *plVar28;
  lyxp_token lVar29;
  lyd_node *plVar30;
  uint8_t *puVar31;
  LY_ECODE code;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  lyd_attr *plVar36;
  uint16_t mod_nam_ns_len;
  lyxp_set *plVar37;
  bool bVar38;
  lyxp_node_type local_8c;
  lyxp_node_type local_88;
  lyxp_node_type local_84;
  char *local_80;
  ushort *local_78;
  ulong local_70;
  lys_module *local_68;
  lyxp_expr *local_60;
  uint local_54;
  lys_node *local_50;
  char local_41;
  ly_ctx *local_40;
  lyxp_set *local_38;
  
  local_80 = "parsed";
  if (set == (lyxp_set *)0x0) {
    local_80 = "skipped";
  }
  local_41 = (options & 0x1cU) == 0 || set == (lyxp_set *)0x0;
  uVar21 = *exp_idx;
  local_78 = exp_idx;
  local_50 = (lys_node *)cur_node;
  local_38 = set;
LAB_0016a647:
  plVar26 = exp->tokens;
  uVar16 = (ulong)uVar21;
  lVar29 = plVar26[uVar16];
  iVar7 = 0x19ed54;
  switch(lVar29) {
  case LYXP_TOKEN_DOT:
    if (set != (lyxp_set *)0x0) {
      if ((options & 0x1cU) == 0) {
        lVar5 = moveto_self(set,(lyd_node *)local_50,all_desc,options);
      }
      else {
        lVar5 = moveto_snode_self(set,local_50,all_desc,options);
      }
      goto switchD_0016a6a9_caseD_0;
    }
    goto LAB_0016b2cd;
  case LYXP_TOKEN_DDOT:
    if (set == (lyxp_set *)0x0) goto LAB_0016b2cd;
    if ((options & 0x1cU) == 0) {
      pcVar27 = "schema node set";
      lVar5 = set->type;
      switch(set->type) {
      case LYXP_SET_EMPTY:
        goto switchD_0016ac02_caseD_0;
      case LYXP_SET_NODE_SET:
        if ((all_desc == 0) ||
           (lVar5 = moveto_self(local_38,(lyd_node *)local_50,1,options), lVar5 == LYXP_SET_EMPTY))
        {
          local_60 = exp;
          plVar11 = (lyd_attr *)moveto_get_root((lyd_node *)local_50,options,&local_84);
          plVar17 = local_38;
          if (local_38->used != 0) {
            uVar16 = 0;
            local_40 = (ly_ctx *)CONCAT44(local_40._4_4_,local_84);
            do {
              uVar34 = (uint)uVar16;
              plVar37 = local_38;
              while( true ) {
                plVar17 = local_38;
                attr = (lyd_attr *)(plVar37->val).nodes[uVar16].node;
                lVar25 = (plVar37->val).nodes[uVar16].type;
                if (lVar25 == LYXP_NODE_ATTR) break;
                plVar12 = attr;
                if (lVar25 == LYXP_NODE_TEXT) goto LAB_0016acbc;
                if (lVar25 == LYXP_NODE_ELEM) {
                  plVar12 = (lyd_attr *)(attr->value).enm;
                  goto LAB_0016acbc;
                }
                set_remove_node(local_38,uVar34);
                plVar37 = plVar17;
                if (plVar17->used <= uVar34) goto LAB_0016ae31;
              }
              plVar12 = (lyd_attr *)lyd_attr_parent((lyd_node *)plVar11,attr);
              if (plVar12 == (lyd_attr *)0x0) {
                pLVar20 = ly_errno_location();
                *pLVar20 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                       ,0x14b8);
                lVar5 = ~LYXP_SET_EMPTY;
                exp = local_60;
                goto switchD_0016ac02_caseD_0;
              }
LAB_0016acbc:
              if ((((options & 2U) != 0) && (plVar12 != (lyd_attr *)0x0)) &&
                 (((ulong)plVar12->next & 0xe00) == 0x800)) {
                lVar5 = LYXP_SET_NODE_SET;
                exp = local_60;
                goto switchD_0016ac02_caseD_0;
              }
              if (plVar11 == attr) {
                if ((options == 0) ||
                   (lVar25 = LYXP_NODE_ROOT_CONFIG, plVar12 = attr, (local_50->name[0x18] & 1U) == 0
                   )) {
                  lVar25 = LYXP_NODE_ROOT;
                  plVar12 = attr;
                }
LAB_0016ad95:
                if ((lVar25 != (lyxp_node_type)local_40) || (plVar12 != plVar11)) {
                  __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                ,0x14e3,
                                "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)")
                  ;
                }
                uVar33 = local_38->used;
                plVar28 = (local_38->val).nodes;
                lVar25 = (lyxp_node_type)local_40;
                if ((ulong)uVar33 == 0) {
                  uVar33 = 0;
                }
                else {
                  plVar13 = &plVar28->type;
                  uVar32 = 0;
                  do {
                    if (((lyd_attr *)((lyxp_set_nodes *)(plVar13 + -2))->node == plVar11) &&
                       (*plVar13 == (lyxp_node_type)local_40)) goto LAB_0016adf3;
                    uVar32 = uVar32 + 1;
                    plVar13 = plVar13 + 4;
                  } while (uVar33 != uVar32);
                }
              }
              else {
                if (plVar12 == (lyd_attr *)0x0) {
                  if ((options == 0) ||
                     (lVar25 = LYXP_NODE_ROOT_CONFIG, (local_50->name[0x18] & 1U) == 0)) {
                    lVar25 = LYXP_NODE_ROOT;
                  }
                  do {
                    plVar36 = attr;
                    attr = (lyd_attr *)plVar36->value_str;
                  } while (attr->name != (char *)0x0);
                  plVar12 = plVar11;
                  if (plVar36 != plVar11) {
                    pLVar20 = ly_errno_location();
                    *pLVar20 = LY_EINT;
                    ly_log(LY_LLERR,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                           ,0x14d9);
                  }
                  goto LAB_0016ad95;
                }
                uVar33 = local_38->used;
                plVar28 = (local_38->val).nodes;
                lVar25 = LYXP_NODE_ELEM;
                if ((ulong)uVar33 != 0) {
                  plVar13 = &plVar28->type;
                  uVar32 = 0;
LAB_0016ad01:
                  if (((lyd_attr *)((lyxp_set_nodes *)(plVar13 + -2))->node != plVar12) ||
                     (*plVar13 != LYXP_NODE_ELEM)) goto LAB_0016ad11;
                  lVar25 = LYXP_NODE_ELEM;
LAB_0016adf3:
                  plVar17 = local_38;
                  if ((int)uVar32 < 0) goto LAB_0016ae07;
                  set_remove_node(local_38,uVar34);
                  uVar33 = plVar17->used;
                  goto LAB_0016ae24;
                }
                uVar33 = 0;
              }
LAB_0016ae07:
              plVar28[uVar16].node = (lyd_node *)plVar12;
              (local_38->val).nodes[uVar16].type = lVar25;
              (local_38->val).nodes[uVar16].pos = 0;
              uVar16 = (ulong)(uVar34 + 1);
LAB_0016ae24:
              plVar17 = local_38;
            } while ((uint)uVar16 < uVar33);
          }
LAB_0016ae31:
          iVar7 = set_sort(plVar17,(lyd_node *)local_50,options);
          if (1 < iVar7) {
            pLVar20 = ly_errno_location();
            *pLVar20 = LY_EINT;
            ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","moveto_parent")
            ;
          }
          exp = local_60;
          uVar34 = plVar17->used;
          lVar5 = LYXP_SET_EMPTY;
          if (1 < uVar34) {
            bVar38 = true;
            uVar16 = 0;
            do {
              plVar17 = local_38;
              uVar16 = uVar16 & 0xffffffff;
              plVar13 = &((local_38->val).nodes + uVar16)[1].type;
              plVar30 = (local_38->val).nodes[uVar16].node;
              while ((plVar28 = (lyxp_set_nodes *)(plVar13 + -2), plVar30 != plVar28->node ||
                     (plVar13[-4] != *plVar13))) {
                uVar16 = uVar16 + 1;
                plVar13 = plVar13 + 4;
                plVar30 = plVar28->node;
                if (uVar34 - 1 <= uVar16) {
                  lVar5 = LYXP_SET_EMPTY;
                  if (!bVar38) goto LAB_0016b79a;
                  goto switchD_0016ac02_caseD_0;
                }
              }
              set_remove_node(local_38,(uint)uVar16 + 1);
              uVar34 = plVar17->used;
              bVar38 = false;
            } while ((uint)uVar16 < uVar34 - 1);
LAB_0016b79a:
            pLVar20 = ly_errno_location();
            *pLVar20 = LY_EINT;
            lVar5 = LYXP_SET_EMPTY;
            ly_log(LY_LLERR,"XPath set includes duplicates (%s).","moveto_parent");
          }
        }
        goto switchD_0016ac02_caseD_0;
      case LYXP_SET_SNODE_SET:
        break;
      case LYXP_SET_BOOLEAN:
        pcVar27 = "boolean";
        break;
      case LYXP_SET_NUMBER:
        pcVar27 = "number";
        break;
      case LYXP_SET_STRING:
        pcVar27 = "string";
        break;
      default:
        pcVar27 = (char *)0x0;
      }
      ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar27);
      lVar5 = ~LYXP_SET_EMPTY;
switchD_0016ac02_caseD_0:
      set = local_38;
      goto switchD_0016a6a9_caseD_0;
    }
    pcVar27 = "node set";
    lVar5 = set->type;
    switch(set->type) {
    case LYXP_SET_EMPTY:
      goto switchD_0016a6a9_caseD_0;
    case LYXP_SET_NODE_SET:
      break;
    case LYXP_SET_SNODE_SET:
      if (all_desc != 0) {
        iVar7 = moveto_snode_self(set,local_50,1,options);
        lVar5 = ~LYXP_SET_EMPTY;
        if (iVar7 != 0) goto switchD_0016a6a9_caseD_0;
      }
      plVar8 = (ly_ctx *)moveto_snode_get_root(local_50,options,&local_88);
      uVar2 = set->used;
      lVar23 = (long)(int)uVar2;
      lVar5 = LYXP_SET_EMPTY;
      if (0 < lVar23) {
        uVar24 = CONCAT71((int7)((ulong)plVar8 >> 8),1);
        lVar35 = 0;
        local_60 = exp;
        local_40 = plVar8;
LAB_0016a6ff:
        local_54 = (uint)uVar24;
        exp = local_60;
        do {
          lVar5 = LYXP_SET_EMPTY;
          if ((set->val).nodes[lVar35].pos == 1) {
            (set->val).nodes[lVar35].pos = 0;
            if ((set->val).nodes[lVar35].type == LYXP_NODE_ELEM) {
              plVar8 = (ly_ctx *)(set->val).nodes[lVar35].node;
              plVar9 = plVar8;
              do {
                plVar9 = (ly_ctx *)lys_parent((lys_node *)plVar9);
                if (plVar9 == (ly_ctx *)0x0) {
                  if (local_40 == plVar8) goto LAB_0016a7e3;
                  if (((options & 0x18U) == 0) ||
                     (lVar25 = LYXP_NODE_ROOT_CONFIG, (local_50->flags & 1) == 0)) {
                    lVar25 = LYXP_NODE_ROOT;
                  }
                  plVar10 = lys_node_module((lys_node *)plVar8);
                  plVar8 = (ly_ctx *)lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar10,0);
                  plVar9 = local_40;
                  if (plVar8 != local_40) {
                    pLVar20 = ly_errno_location();
                    *pLVar20 = LY_EINT;
                    ly_log(LY_LLERR,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                           ,0x153c);
                    plVar9 = local_40;
                  }
                  goto LAB_0016a7fb;
                }
              } while (((ulong)(plVar9->dict).recs[2].value & 0x1642) != 0);
              if (local_40 == plVar8) {
LAB_0016a7e3:
                if (((options & 0x18U) == 0) ||
                   (lVar25 = LYXP_NODE_ROOT_CONFIG, plVar9 = plVar8, (local_50->flags & 1) == 0)) {
                  lVar25 = LYXP_NODE_ROOT;
                  plVar9 = plVar8;
                }
LAB_0016a7fb:
                if ((lVar25 != local_88) || (plVar9 != local_40)) {
                  __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                ,0x1546,
                                "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                               );
                }
              }
              else {
                lVar25 = LYXP_NODE_ELEM;
              }
              iVar7 = set_snode_insert_node(local_38,(lys_node *)plVar9,lVar25);
              set = local_38;
              exp = local_60;
              if (iVar7 < (int)uVar2 && lVar35 < iVar7) goto LAB_0016a844;
            }
          }
          lVar35 = lVar35 + 1;
          if (lVar35 == lVar23) {
            if ((local_54 & 1) == 0) goto LAB_0016b5f3;
            break;
          }
        } while( true );
      }
      goto switchD_0016a6a9_caseD_0;
    case LYXP_SET_BOOLEAN:
      pcVar27 = "boolean";
      break;
    case LYXP_SET_NUMBER:
      pcVar27 = "number";
      break;
    case LYXP_SET_STRING:
      pcVar27 = "string";
      break;
    default:
      pcVar27 = (char *)0x0;
    }
    ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar27);
    lVar5 = ~LYXP_SET_EMPTY;
    goto switchD_0016a6a9_caseD_0;
  case LYXP_TOKEN_AT:
    iVar7 = 0x19ed54;
    if ('\x02' < ly_log_level) {
      iVar7 = 0x19e9c6;
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_80,"@",
                 (ulong)exp->expr_pos[uVar16]);
      uVar21 = *exp_idx;
      plVar26 = exp->tokens;
    }
    *exp_idx = uVar21 + 1;
    uVar16 = (ulong)(ushort)(uVar21 + 1);
    lVar29 = plVar26[uVar16];
    bVar38 = false;
    break;
  default:
    pLVar20 = ly_errno_location();
    *pLVar20 = LY_EINT;
    uVar24 = 0x17ee;
LAB_0016babb:
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
           uVar24);
    return -1;
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    bVar38 = true;
  }
  plVar4 = local_50;
  if (lVar29 == LYXP_TOKEN_NODETYPE) {
    pcVar27 = "skipped";
    if (set == (lyxp_set *)0x0) goto switchD_0016aaf3_caseD_0;
    if (exp->tok_len[uVar16] != '\x04') {
      __assert_fail("exp->tok_len[*exp_idx] == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x168e,
                    "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                   );
    }
    lVar5 = local_38->type;
    if (lVar5 == LYXP_SET_SNODE_SET) {
      uVar34 = local_38->used;
      pcVar27 = "skipped";
      if ((ulong)uVar34 != 0) {
        lVar23 = 0;
        do {
          if (*(int *)((long)&((local_38->val).nodes)->pos + lVar23) == 1) {
            *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar23) = 0;
          }
          lVar23 = lVar23 + 0x10;
        } while ((ulong)uVar34 << 4 != lVar23);
        pcVar27 = "skipped";
      }
      goto switchD_0016aaf3_caseD_0;
    }
    uVar21 = exp->expr_pos[uVar16];
    pcVar27 = exp->expr;
    iVar7 = strncmp(pcVar27 + uVar21,"node",4);
    if (iVar7 == 0) {
      pcVar27 = "parsed";
      if (lVar5 != LYXP_SET_NODE_SET) {
        lyxp_set_cast(local_38,LYXP_SET_EMPTY,(lyd_node *)local_50,param_4,options);
        pcVar27 = "parsed";
      }
      goto switchD_0016aaf3_caseD_0;
    }
    iVar7 = strncmp(pcVar27 + uVar21,"text",4);
    plVar17 = local_38;
    if (iVar7 != 0) {
      __assert_fail("!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], \"text\", 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x1699,
                    "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                   );
    }
    pcVar27 = "parsed";
    switch(lVar5) {
    case LYXP_SET_EMPTY:
      goto switchD_0016aaf3_caseD_0;
    case LYXP_SET_NODE_SET:
      uVar34 = local_38->used;
      pcVar27 = "parsed";
      if (uVar34 != 0) {
        uVar16 = 0;
        do {
          lVar25 = (plVar17->val).nodes[uVar16].type;
          if (lVar25 < (LYXP_NODE_ATTR|LYXP_NODE_ROOT_CONFIG)) {
            if (lVar25 == LYXP_NODE_ELEM) {
              plVar28 = (plVar17->val).nodes + uVar16;
              plVar30 = plVar28->node;
              if ((char)plVar30->validity < '\0') {
                ly_vlog(LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar30,plVar30->schema->name);
                return -1;
              }
              if (((plVar30->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                 (plVar30->child != (lyd_node *)0x0)) {
                plVar28->type = LYXP_NODE_TEXT;
                uVar16 = (ulong)((uint32_t)uVar16 + 1);
                goto LAB_0016ab39;
              }
            }
            set_remove_node(plVar17,(uint32_t)uVar16);
            uVar34 = plVar17->used;
          }
LAB_0016ab39:
        } while ((uint)uVar16 < uVar34);
        pcVar27 = "parsed";
      }
      goto switchD_0016aaf3_caseD_0;
    default:
      pcVar27 = (char *)0x0;
      break;
    case LYXP_SET_BOOLEAN:
      pcVar27 = "boolean";
      break;
    case LYXP_SET_NUMBER:
      pcVar27 = "number";
      break;
    case LYXP_SET_STRING:
      pcVar27 = "string";
    }
    pcVar15 = "text()";
    code = LYE_XPATH_INCTX;
LAB_0016bb77:
    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar27,pcVar15);
    return -1;
  }
  if (lVar29 != LYXP_TOKEN_NAMETEST) {
    pLVar20 = ly_errno_location();
    *pLVar20 = LY_EINT;
    uVar24 = 0x16b0;
    goto LAB_0016babb;
  }
  if (bVar38) {
    if (all_desc == 0) {
      if (set == (lyxp_set *)0x0) {
        pcVar27 = exp->expr;
        puVar14 = exp->expr_pos;
        puVar31 = exp->tok_len;
      }
      else {
        pcVar27 = exp->expr;
        puVar14 = exp->expr_pos;
        puVar31 = exp->tok_len;
        if (set->type == LYXP_SET_SNODE_SET) {
          lVar5 = moveto_snode(set,local_50,pcVar27 + puVar14[uVar16],(ushort)puVar31[uVar16],
                               options);
          goto switchD_0016af18_caseD_0;
        }
      }
      lVar5 = moveto_node(set,(lyd_node *)local_50,pcVar27 + puVar14[uVar16],(ushort)puVar31[uVar16]
                          ,options);
      goto switchD_0016af18_caseD_0;
    }
    pcVar27 = exp->expr + exp->expr_pos[uVar16];
    bVar1 = exp->tok_len[uVar16];
    uVar34 = (uint)bVar1;
    if (local_41 != '\0') {
      lVar5 = moveto_node_alldesc(set,(lyd_node *)local_50,pcVar27,(ushort)bVar1,options);
      goto switchD_0016af18_caseD_0;
    }
    lVar5 = set->type;
    pcVar15 = "node set";
    switch(lVar5) {
    case LYXP_SET_EMPTY:
      goto switchD_0016af18_caseD_0;
    case LYXP_SET_NODE_SET:
      break;
    case LYXP_SET_SNODE_SET:
      local_40 = local_50->module->ctx;
      local_60 = exp;
      moveto_snode_get_root(local_50,options,&local_8c);
      iVar7 = options;
      iVar6 = moveto_snode(set,plVar4,pcVar27,(ushort)bVar1,options);
      lVar5 = ~LYXP_SET_EMPTY;
      exp = local_60;
      if (iVar6 == 0) {
        pcVar15 = strnchr(pcVar27,0x3a,uVar34);
        if (pcVar15 == (char *)0x0) {
          local_68 = (lys_module *)0x0;
        }
        else {
          pcVar15 = strnchr(pcVar27,0x3a,uVar34);
          uVar33 = (int)pcVar15 - (int)pcVar27;
          local_68 = moveto_resolve_model(pcVar27,(uint16_t)uVar33,local_40,local_50,iVar7);
          if (local_68 == (lys_module *)0x0) {
            ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar33,pcVar27);
            exp = local_60;
            goto switchD_0016af18_caseD_0;
          }
          pcVar27 = pcVar27 + (long)(int)uVar33 + 1;
          uVar34 = ~uVar33 + uVar34;
        }
        local_54 = CONCAT31(local_54._1_3_,1);
        if ((short)uVar34 == 1) {
          local_54 = CONCAT31(local_54._1_3_,*pcVar27 != '*');
        }
        local_40 = (ly_ctx *)(long)(int)set->used;
        lVar5 = LYXP_SET_EMPTY;
        exp = local_60;
        if (0 < (long)local_40) {
          local_70 = (ulong)(uVar34 & 0xffff);
          plVar8 = (ly_ctx *)0x0;
          do {
            if (((set->val).nodes[(long)plVar8].pos == 1) &&
               (plVar4 = (lys_node *)(set->val).nodes[(long)plVar8].node, plVar19 = plVar4,
               plVar4 != (lys_node *)0x0)) {
              do {
                do {
                  node = plVar19;
                  plVar10 = local_68;
                  if ((local_8c == LYXP_NODE_ROOT_CONFIG) && ((node->flags & 2) != 0)) break;
                  LVar3 = node->nodetype;
                  if (0x3ff < (int)LVar3) {
                    if (LVar3 == LYS_OUTPUT) {
                      if ((options & 0x20U) != 0) goto LAB_0016b97f;
                    }
                    else if (LVar3 != LYS_GROUPING) {
                      if (LVar3 != LYS_USES) goto LAB_0016b895;
                      goto LAB_0016b97f;
                    }
                    break;
                  }
                  if ((LVar3 != LYS_CHOICE) && (LVar3 != LYS_CASE)) {
                    if (LVar3 == LYS_INPUT) {
                      if ((options & 0x20U) != 0) break;
                    }
                    else {
LAB_0016b895:
                      if (local_68 == (lys_module *)0x0) {
                        bVar38 = false;
                      }
                      else {
                        plVar18 = lys_node_module(node);
                        bVar38 = plVar18 != plVar10;
                      }
                      if ((char)local_54 == '\0') {
LAB_0016b900:
                        if (node != plVar4 && !bVar38) {
                          if ((ly_ctx *)(ulong)local_38->used != (ly_ctx *)0x0) {
                            plVar9 = (ly_ctx *)0x0;
                            do {
                              if (((plVar9 != plVar8) &&
                                  (plVar28 = (local_38->val).nodes,
                                  (lys_node *)plVar28[(long)plVar9].node == node)) &&
                                 (plVar28[(long)plVar9].type == LYXP_NODE_ELEM)) {
                                if (-1 < (int)(uint)plVar9) {
                                  plVar9 = (ly_ctx *)(ulong)((uint)plVar9 & 0x7fffffff);
                                  plVar28[(long)plVar9].pos = 1;
                                  if (plVar9 <= plVar8) goto LAB_0016b97f;
                                  goto LAB_0016b9a2;
                                }
                                break;
                              }
                              plVar9 = (ly_ctx *)((long)&(plVar9->dict).recs[0].next + 1);
                            } while (plVar9 != (ly_ctx *)(ulong)local_38->used);
                          }
                          set_snode_insert_node(local_38,node,LYXP_NODE_ELEM);
                          goto LAB_0016b97f;
                        }
                      }
                      else {
                        pcVar15 = node->name;
                        iVar7 = strncmp(pcVar15,pcVar27,local_70);
                        if ((iVar7 == 0) && (pcVar15[local_70] == '\0')) goto LAB_0016b900;
                        bVar38 = true;
                      }
                      if ((node == plVar4) && (bVar38)) {
                        pLVar20 = ly_errno_location();
                        *pLVar20 = LY_EINT;
                        ly_log(LY_LLERR,"Internal error (%s:%d).",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                               ,0x12eb);
                      }
                    }
                  }
LAB_0016b97f:
                  plVar19 = node->child;
                } while (node->child != (lys_node *)0x0 &&
                         (node->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN);
LAB_0016b9a2:
                if (node == plVar4) break;
                plVar19 = node->next;
                while (plVar19 == (lys_node *)0x0) {
                  plVar19 = lys_parent(node);
                  if (plVar19 == plVar4) goto LAB_0016b9f1;
                  node = lys_parent(node);
                  plVar19 = node->next;
                }
              } while( true );
            }
LAB_0016b9f1:
            plVar8 = (ly_ctx *)((long)&(plVar8->dict).recs[0].next + 1);
            set = local_38;
            exp = local_60;
          } while (plVar8 != local_40);
        }
      }
      goto switchD_0016af18_caseD_0;
    case LYXP_SET_BOOLEAN:
      pcVar15 = "boolean";
      break;
    case LYXP_SET_NUMBER:
      pcVar15 = "number";
      break;
    case LYXP_SET_STRING:
      pcVar15 = "string";
      break;
    default:
      pcVar15 = (char *)0x0;
    }
    ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar15);
    lVar5 = ~LYXP_SET_EMPTY;
switchD_0016af18_caseD_0:
    if ((set == (lyxp_set *)0x0) || (lVar5 != LYXP_SET_EMPTY)) {
      if (lVar5 != LYXP_SET_EMPTY) {
        return lVar5;
      }
    }
    else if ((options & 0x1cU) != 0) {
      uVar16 = (ulong)set->used;
      do {
        uVar16 = uVar16 - 1;
        if ((int)(uint)uVar16 < 0) {
          if (uVar16 == 0xffffffffffffffff) {
            ly_vlog(LYE_XPATH_INSNODE,LY_VLOG_NONE,(void *)0x0,(ulong)exp->tok_len[*local_78],
                    exp->expr + exp->expr_pos[*local_78],
                    (ulong)((uint)exp->expr_pos[*local_78] + (uint)exp->tok_len[*local_78]),
                    exp->expr);
            return -1;
          }
          break;
        }
      } while ((set->val).nodes[(uint)uVar16 & 0x7fffffff].pos == 0);
    }
  }
  else {
    if (local_41 == '\0') {
      uVar34 = set->used;
      if ((ulong)uVar34 != 0) {
        lVar23 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar23) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar23) = 0;
          }
          lVar23 = lVar23 + 0x10;
        } while ((ulong)uVar34 << 4 != lVar23);
      }
      goto switchD_0016aa05_caseD_0;
    }
    plVar10 = (lys_module *)(exp->expr + exp->expr_pos[uVar16]);
    bVar1 = exp->tok_len[uVar16];
    uVar34 = (uint)bVar1;
    local_68 = plVar10;
    if (all_desc != 0) {
      if (set == (lyxp_set *)0x0) goto switchD_0016aa05_caseD_0;
      switch(set->type) {
      case LYXP_SET_EMPTY:
        goto switchD_0016aa05_caseD_0;
      case LYXP_SET_NODE_SET:
        local_60 = exp;
        local_40 = (ly_ctx *)(ulong)bVar1;
        pcVar27 = strnchr((char *)plVar10,0x3a,uVar34);
        if (pcVar27 == (char *)0x0) {
          plVar18 = (lys_module *)0x0;
        }
        else {
          pcVar27 = strnchr((char *)plVar10,0x3a,uVar34);
          plVar18 = moveto_resolve_model
                              ((char *)plVar10,(uint16_t)((long)pcVar27 - (long)plVar10),
                               (ly_ctx *)**(undefined8 **)(local_50->name + 0x30),(lys_node *)0x0,
                               iVar7);
          if (plVar18 == (lys_module *)0x0) {
            pLVar20 = ly_errno_location();
            *pLVar20 = LY_EINT;
            uVar24 = 0x13b8;
            goto LAB_0016babb;
          }
          uVar33 = (uint)((long)pcVar27 - (long)plVar10);
          local_68 = (lys_module *)((long)&plVar10->ctx + (long)(int)uVar33 + 1);
          local_40 = (ly_ctx *)(ulong)(~uVar33 + uVar34);
        }
        plVar17 = set_copy(set);
        plVar4 = local_50;
        iVar7 = moveto_node_alldesc(plVar17,(lyd_node *)local_50,"*",1,options);
        if (iVar7 != 0) {
          lyxp_set_free(plVar17);
          return iVar7;
        }
        iVar7 = moveto_union(set,plVar17,(lyd_node *)plVar4,options);
        lyxp_set_free(plVar17);
        if (iVar7 != 0) {
          return -1;
        }
        bVar38 = true;
        if ((short)local_40 == 1) {
          bVar38 = *(char *)&local_68->ctx != '*';
        }
        exp = local_60;
        if (set->used != 0) {
          uVar16 = (ulong)local_40 & 0xffff;
          uVar32 = 0;
          local_70 = uVar16;
          do {
            if (((set->val).nodes[uVar32].type == LYXP_NODE_ELEM) &&
               (plVar11 = ((set->val).nodes[uVar32].node)->attr, exp = local_60,
               plVar11 != (lyd_attr *)0x0)) {
              uVar34 = 0;
              do {
                if ((plVar18 == (lys_module *)0x0) || (plVar11->annotation->module == plVar18)) {
                  if (bVar38) {
                    local_40 = (ly_ctx *)CONCAT44(local_40._4_4_,(int)uVar32);
                    pcVar27 = plVar11->name;
                    local_54 = uVar34;
                    iVar7 = strncmp(pcVar27,(char *)local_68,uVar16);
                    uVar34 = local_54;
                    if (iVar7 == 0) {
                      uVar32 = (ulong)local_40 & 0xffffffff;
                      if (pcVar27[uVar16] == '\0') goto LAB_0016b55b;
                    }
                    else {
                      uVar32 = (ulong)local_40 & 0xffffffff;
                    }
                  }
                  else {
LAB_0016b55b:
                    if (uVar34 == 0) {
                      (local_38->val).nodes[uVar32].node = (lyd_node *)plVar11;
                      (local_38->val).nodes[uVar32].type = LYXP_NODE_ATTR;
                    }
                    else {
                      set_insert_node(local_38,plVar11,(local_38->val).nodes[uVar32].pos,
                                      LYXP_NODE_ATTR,(int)uVar32 + 1);
                      uVar16 = local_70;
                    }
                    uVar32 = (ulong)((int)uVar32 + 1);
                    uVar34 = 1;
                  }
                }
                plVar11 = plVar11->next;
              } while (plVar11 != (lyd_attr *)0x0);
              set = local_38;
              exp = local_60;
              if (uVar34 == 0) goto LAB_0016b5c5;
            }
            else {
LAB_0016b5c5:
              set_remove_node(set,(uint32_t)uVar32);
              uVar16 = local_70;
            }
          } while ((uint)uVar32 < set->used);
        }
        goto switchD_0016aa05_caseD_0;
      case LYXP_SET_SNODE_SET:
switchD_0016aa05_caseD_2:
        pcVar15 = "schema node set";
        break;
      case LYXP_SET_BOOLEAN:
switchD_0016aa05_caseD_3:
        pcVar15 = "boolean";
        break;
      case LYXP_SET_NUMBER:
switchD_0016aa05_caseD_4:
        pcVar15 = "number";
        break;
      case LYXP_SET_STRING:
switchD_0016aa05_caseD_5:
        pcVar15 = "string";
        break;
      default:
switchD_0016aa05_default:
        pcVar15 = (char *)0x0;
      }
      pcVar27 = "path operator";
      code = LYE_XPATH_INOP_1;
      goto LAB_0016bb77;
    }
    if (set != (lyxp_set *)0x0) {
      switch(set->type) {
      case LYXP_SET_EMPTY:
        break;
      case LYXP_SET_NODE_SET:
        goto switchD_0016b02d_caseD_1;
      case LYXP_SET_SNODE_SET:
        goto switchD_0016aa05_caseD_2;
      case LYXP_SET_BOOLEAN:
        goto switchD_0016aa05_caseD_3;
      case LYXP_SET_NUMBER:
        goto switchD_0016aa05_caseD_4;
      case LYXP_SET_STRING:
        goto switchD_0016aa05_caseD_5;
      default:
        goto switchD_0016aa05_default;
      }
    }
  }
switchD_0016aa05_caseD_0:
  uVar21 = *local_78;
  pcVar27 = local_80;
  puVar14 = local_78;
  goto joined_r0x0016b1b5;
switchD_0016aaf3_caseD_0:
  puVar14 = local_78;
  uVar21 = *local_78;
  if ('\x02' < ly_log_level) {
    pcVar15 = print_token(exp->tokens[uVar21]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar27,pcVar15,
               (ulong)exp->expr_pos[*puVar14]);
    uVar21 = *puVar14;
  }
  uVar21 = uVar21 + 1;
  *puVar14 = uVar21;
  if ('\x02' < ly_log_level) {
    pcVar15 = print_token(exp->tokens[uVar21]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar27,pcVar15,
               (ulong)exp->expr_pos[*puVar14]);
    uVar21 = *puVar14;
  }
  uVar21 = uVar21 + 1;
  *puVar14 = uVar21;
  set = local_38;
joined_r0x0016b1b5:
  if ('\x02' < ly_log_level) {
    pcVar15 = print_token(exp->tokens[uVar21]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar27,pcVar15,
               (ulong)exp->expr_pos[*puVar14]);
    uVar21 = *puVar14;
  }
  *puVar14 = uVar21 + 1;
  while( true ) {
    uVar22 = exp->used;
    uVar21 = *puVar14;
    if ((uVar22 <= uVar21) || (exp->tokens[uVar21] != LYXP_TOKEN_BRACK1)) break;
    iVar7 = eval_predicate(exp,puVar14,(lyd_node *)local_50,param_4,set,options);
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  goto LAB_0016b326;
switchD_0016b02d_caseD_1:
  pcVar27 = strnchr((char *)plVar10,0x3a,uVar34);
  if ((local_50 == (lys_node *)0x0) || (pcVar27 == (char *)0x0)) {
    plVar18 = (lys_module *)0x0;
    uVar21 = (ushort)bVar1;
  }
  else {
    pcVar27 = strnchr((char *)plVar10,0x3a,uVar34);
    mod_nam_ns_len = (uint16_t)((long)pcVar27 - (long)plVar10);
    plVar18 = moveto_resolve_model
                        ((char *)plVar10,mod_nam_ns_len,
                         (ly_ctx *)**(undefined8 **)(local_50->name + 0x30),(lys_node *)0x0,iVar7);
    if (plVar18 == (lys_module *)0x0) {
      pLVar20 = ly_errno_location();
      *pLVar20 = LY_EINT;
      uVar24 = 0x1331;
      goto LAB_0016babb;
    }
    local_68 = (lys_module *)((long)&plVar10->ctx + (long)(int)((long)pcVar27 - (long)plVar10) + 1);
    uVar21 = ~mod_nam_ns_len + (ushort)bVar1;
    set = local_38;
  }
  bVar38 = true;
  if (uVar21 == 1) {
    bVar38 = *(char *)&local_68->ctx != '*';
  }
  if (set->used != 0) {
    uVar16 = (ulong)uVar21;
    uVar32 = 0;
    local_70 = uVar16;
    local_60 = exp;
    do {
      if ((((set->val).nodes[uVar32].type == LYXP_NODE_ELEM) &&
          (plVar30 = (set->val).nodes[uVar32].node, -1 < (char)plVar30->validity)) &&
         (plVar11 = plVar30->attr, exp = local_60, plVar11 != (lyd_attr *)0x0)) {
        uVar34 = 0;
        do {
          if ((plVar18 == (lys_module *)0x0) || (plVar11->annotation->module == plVar18)) {
            if (bVar38) {
              local_40 = (ly_ctx *)CONCAT44(local_40._4_4_,(int)uVar32);
              pcVar27 = plVar11->name;
              local_54 = uVar34;
              iVar7 = strncmp(pcVar27,(char *)local_68,uVar16);
              uVar34 = local_54;
              if (iVar7 == 0) {
                uVar32 = (ulong)local_40 & 0xffffffff;
                if (pcVar27[uVar16] == '\0') goto LAB_0016b6de;
              }
              else {
                uVar32 = (ulong)local_40 & 0xffffffff;
              }
            }
            else {
LAB_0016b6de:
              if (uVar34 == 0) {
                (local_38->val).nodes[uVar32].node = (lyd_node *)plVar11;
                (local_38->val).nodes[uVar32].type = LYXP_NODE_ATTR;
              }
              else {
                set_insert_node(local_38,plVar11,(local_38->val).nodes[uVar32].pos,LYXP_NODE_ATTR,
                                (int)uVar32 + 1);
                uVar16 = local_70;
              }
              uVar32 = (ulong)((int)uVar32 + 1);
              uVar34 = 1;
            }
          }
          plVar11 = plVar11->next;
        } while (plVar11 != (lyd_attr *)0x0);
        set = local_38;
        exp = local_60;
        if (uVar34 == 0) goto LAB_0016b748;
      }
      else {
LAB_0016b748:
        set_remove_node(set,(uint32_t)uVar32);
        uVar16 = local_70;
      }
    } while ((uint)uVar32 < set->used);
  }
  goto switchD_0016aa05_caseD_0;
LAB_0016ad11:
  uVar32 = uVar32 + 1;
  plVar13 = plVar13 + 4;
  if (uVar33 == uVar32) goto LAB_0016ae07;
  goto LAB_0016ad01;
LAB_0016a844:
  (local_38->val).nodes[iVar7].pos = 2;
  lVar35 = lVar35 + 1;
  uVar24 = 0;
  if (lVar35 == lVar23) goto LAB_0016b5f3;
  goto LAB_0016a6ff;
LAB_0016b5f3:
  lVar35 = 0xc;
  do {
    if (*(int *)((long)&((set->val).nodes)->node + lVar35) == 2) {
      *(undefined4 *)((long)&((set->val).nodes)->node + lVar35) = 1;
    }
    lVar35 = lVar35 + 0x10;
    lVar23 = lVar23 + -1;
  } while (lVar23 != 0);
switchD_0016a6a9_caseD_0:
  if (lVar5 != LYXP_SET_EMPTY) {
    return lVar5;
  }
  uVar21 = *local_78;
  exp_idx = local_78;
LAB_0016b2cd:
  if ('\x02' < ly_log_level) {
    pcVar27 = print_token(exp->tokens[uVar21]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_80,pcVar27,
               (ulong)exp->expr_pos[*exp_idx]);
    uVar21 = *exp_idx;
  }
  uVar21 = uVar21 + 1;
  *exp_idx = uVar21;
  uVar22 = exp->used;
LAB_0016b326:
  exp_idx = local_78;
  if (uVar22 <= uVar21) {
    return 0;
  }
  if (exp->tokens[uVar21] != LYXP_TOKEN_OPERATOR_PATH) {
    return 0;
  }
  all_desc = 0;
  if (exp->tok_len[uVar21] != '\x01') {
    if (exp->tok_len[uVar21] != '\x02') {
      __assert_fail("exp->tok_len[*exp_idx] == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x17b0,
                    "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                   );
    }
    all_desc = 1;
  }
  if ('\x02' < ly_log_level) {
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_80,"Operator(Path)"
               ,(ulong)exp->expr_pos[uVar21]);
    uVar21 = *exp_idx;
  }
  uVar21 = uVar21 + 1;
  *exp_idx = uVar21;
  goto LAB_0016a647;
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;
        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
                if (ret) {
                    return ret;
                }
            }
            break;
        default:
            LOGINT;
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}